

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O3

string * __thiscall
enact::AstSerialise::visitTupleExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,TupleExpr *expr)

{
  pointer puVar1;
  Expr *pEVar2;
  string *psVar3;
  ostream *poVar4;
  pointer puVar5;
  string separator;
  ostringstream s;
  char *local_1f0;
  char *local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  char local_1d0;
  undefined7 uStack_1cf;
  long local_1c8;
  long local_1c0 [2];
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1f0 = (char *)CONCAT71(local_1f0._1_7_,0x28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1f0,1);
  local_1f0 = &local_1e0;
  local_1e8 = (char *)0x0;
  local_1e0 = '\0';
  puVar5 = (expr->elems).
           super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (expr->elems).
           super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1f0,(long)local_1e8);
      pEVar2 = (puVar5->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
               super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
      (*pEVar2->_vptr_Expr[2])(&local_1d0,pEVar2,&this->field_0x8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(char *)CONCAT71(uStack_1cf,local_1d0),local_1c8);
      if ((long *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
        operator_delete((long *)CONCAT71(uStack_1cf,local_1d0),local_1c0[0] + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_1f0,0,local_1e8,0x11d1ad);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  local_1d0 = ')';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d0,1);
  psVar3 = local_1b0;
  std::__cxx11::stringbuf::str();
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string AstSerialise::visitTupleExpr(TupleExpr &expr) {
        std::ostringstream s;
        s << '(';

        std::string separator;
        for (const std::unique_ptr<Expr>& elem : expr.elems) {
            s << separator << visitExpr(*elem);
            separator = ", ";
        }

        s << ')';
        return s.str();
    }